

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.hpp
# Opt level: O2

ostream * plot::detail::operator<<(ostream *stream,value_type *line)

{
  undefined1 uVar1;
  int iVar2;
  ostream *poVar3;
  Size SVar4;
  
  uVar1 = std::ios::fill();
  std::operator<<(stream,0x20);
  if ((line->overflow_ == 0) &&
     (((line->line_).line_.line_.line_.it_._M_current !=
       (line->end_).line_.line_.line_.it_._M_current ||
      ((line->line_).line_.overflow_ != (line->end_).line_.overflow_)))) {
    *(long *)(stream + *(long *)(*(long *)stream + -0x18) + 0x10) = (long)(int)line->margin_->left_;
    poVar3 = std::operator<<(stream,"");
    poVar3 = operator<<(poVar3,&(line->line_).line_);
    iVar2 = (int)line->margin_->right_;
  }
  else {
    SVar4 = Margin<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>::size(line->margin_);
    iVar2 = (int)SVar4.x;
    poVar3 = stream;
  }
  *(long *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x10) = (long)iVar2;
  std::operator<<(poVar3,"");
  poVar3 = std::operator<<(stream,uVar1);
  return poVar3;
}

Assistant:

inline std::ostream& operator<<(std::ostream& stream, margin_line<Block> const& line) {
        auto fill = stream.fill();
        stream << std::setfill(' ');
        if (!line.overflow_ && line.line_ != line.end_) {
            stream << std::setw(line.margin_->left_)
                   << u8""
                   << *line.line_
                   << std::setw(line.margin_->right_)
                   << u8"";
        } else {
            stream << std::setw(line.margin_->size().x)
                   << u8"";
        }

        return stream << std::setfill(fill);
    }